

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

nh_msgtype_rules * copy_msgtype_rules(nh_msgtype_rules *in)

{
  int iVar1;
  nh_msgtype_rules *__ptr;
  nh_msgtype_rule *__dest;
  
  if (((in != (nh_msgtype_rules *)0x0) && (iVar1 = in->num_rules, iVar1 != 0)) &&
     (__ptr = (nh_msgtype_rules *)malloc(0x10), __ptr != (nh_msgtype_rules *)0x0)) {
    __ptr->num_rules = iVar1;
    __dest = (nh_msgtype_rule *)malloc((ulong)(uint)(iVar1 * 0x7c));
    __ptr->rules = __dest;
    if (__dest != (nh_msgtype_rule *)0x0) {
      memcpy(__dest,in->rules,(ulong)(uint)(iVar1 * 0x7c));
      return __ptr;
    }
    free(__ptr);
  }
  return (nh_msgtype_rules *)0x0;
}

Assistant:

static struct nh_msgtype_rules *copy_msgtype_rules(const struct nh_msgtype_rules *in)
{
    struct nh_msgtype_rules *out;
    unsigned int size;

    if (!in || !in->num_rules)
	return NULL;

    out = malloc(sizeof(struct nh_msgtype_rules));
    if (!out)
	return NULL;

    out->num_rules = in->num_rules;
    size = out->num_rules * sizeof(struct nh_msgtype_rule);
    out->rules = malloc(size);
    if (!out->rules) {
	free(out);
	return NULL;
    }
    memcpy(out->rules, in->rules, size);

    return out;
}